

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::SetKeyboardFocusHere(int offset)

{
  ImGuiWindow *window;
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiScrollFlags scroll_flags;
  
  pIVar1 = GImGui;
  window = GImGui->CurrentWindow;
  if ((GImGui->DebugLogFlags & 1) != 0) {
    DebugLog("SetKeyboardFocusHere(%d) in window \"%s\"\n",offset,window->Name);
  }
  if ((pIVar1->DragDropActive == false) && (pIVar1->MovingWindow == (ImGuiWindow *)0x0)) {
    SetNavWindow(window);
    scroll_flags = 3;
    if (window->Appearing != false) {
      scroll_flags = 0x21;
    }
    NavMoveRequestSubmit(-1,(uint)offset >> 0x1f ^ 3,0x600,scroll_flags);
    if (offset == -1) {
      GImGui->NavMoveScoringItems = false;
      NavApplyItemToResult(&pIVar1->NavMoveResultLocal);
      bVar2 = true;
      if (GImGui->NavMoveScoringItems == false) {
        bVar2 = GImGui->NavInitRequest;
      }
      GImGui->NavAnyRequest = bVar2;
    }
    else {
      pIVar1->NavTabbingDir = 1;
      pIVar1->NavTabbingCounter = offset + 1;
    }
  }
  else if ((pIVar1->DebugLogFlags & 1) != 0) {
    DebugLog("SetKeyboardFocusHere() ignored while DragDropActive!\n");
    return;
  }
  return;
}

Assistant:

void ImGui::SetKeyboardFocusHere(int offset)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(offset >= -1);    // -1 is allowed but not below
    IMGUI_DEBUG_LOG_ACTIVEID("SetKeyboardFocusHere(%d) in window \"%s\"\n", offset, window->Name);

    // It makes sense in the vast majority of cases to never interrupt a drag and drop.
    // When we refactor this function into ActivateItem() we may want to make this an option.
    // MovingWindow is protected from most user inputs using SetActiveIdUsingNavAndKeys(), but
    // is also automatically dropped in the event g.ActiveId is stolen.
    if (g.DragDropActive || g.MovingWindow != NULL)
    {
        IMGUI_DEBUG_LOG_ACTIVEID("SetKeyboardFocusHere() ignored while DragDropActive!\n");
        return;
    }

    SetNavWindow(window);

    ImGuiScrollFlags scroll_flags = window->Appearing ? ImGuiScrollFlags_KeepVisibleEdgeX | ImGuiScrollFlags_AlwaysCenterY : ImGuiScrollFlags_KeepVisibleEdgeX | ImGuiScrollFlags_KeepVisibleEdgeY;
    NavMoveRequestSubmit(ImGuiDir_None, offset < 0 ? ImGuiDir_Up : ImGuiDir_Down, ImGuiNavMoveFlags_Tabbing | ImGuiNavMoveFlags_FocusApi, scroll_flags); // FIXME-NAV: Once we refactor tabbing, add LegacyApi flag to not activate non-inputable.
    if (offset == -1)
    {
        NavMoveRequestResolveWithLastItem(&g.NavMoveResultLocal);
    }
    else
    {
        g.NavTabbingDir = 1;
        g.NavTabbingCounter = offset + 1;
    }
}